

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  Hash HVar2;
  Hash *pHVar3;
  _func_int ***ppp_Var4;
  pointer puVar5;
  _Manager_type p_Var6;
  bool bVar7;
  int iVar8;
  int iVar9;
  DatabaseInterface *this;
  DatabaseInterface *output_db;
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> _Var10;
  ulong uVar11;
  size_type sVar12;
  _Alloc_hider _Var13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  unsigned_long *h;
  pointer puVar17;
  Hash *pHVar18;
  size_t sStack_c80;
  bool should_filter_application_hash;
  bool invert_module_pruning;
  bool skip_application_info_links;
  DatabaseInterface *local_c68;
  Hash latest_hash;
  size_t hash_count;
  uint timestamp_seconds;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  Hash application_hash;
  vector<unsigned_long,_std::allocator<unsigned_long>_> accepted_hashes;
  uint64_t ts;
  unsigned_long hash;
  StateReplayer replayer;
  uint per_tag_written [10];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  __node_base_ptr p_Stack_b88;
  CLICallbacks cbs;
  string blacklist;
  string whitelist;
  string timestamp;
  string output_db_path;
  string input_db_path;
  uint per_tag_read [10];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_graphics;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_graphics;
  undefined1 local_878 [16];
  _Manager_type local_868;
  __node_base local_860;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_838;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_800;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_7c8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_790;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_758;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_720;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_6e8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_6b0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_678;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_640;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_608;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_5d0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_598;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_560;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_528 [15];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1e0 [2];
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> local_170;
  uint64_t local_168;
  Hash local_160;
  bool local_158;
  undefined2 local_148;
  bool local_146;
  CLIParser parser;
  CLICallbacks local_a8;
  
  cbs.callbacks._M_h._M_buckets = &cbs.callbacks._M_h._M_single_bucket;
  cbs.callbacks._M_h._M_bucket_count = 1;
  cbs.callbacks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  cbs.callbacks._M_h._M_element_count = 0;
  cbs.callbacks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  cbs.callbacks._M_h._M_rehash_policy._M_next_resize = 0;
  cbs.callbacks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cbs.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  cbs.error_handler.super__Function_base._M_functor._8_8_ = 0;
  cbs.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  cbs.error_handler._M_invoker = (_Invoker_type)0x0;
  cbs.default_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  cbs.default_handler.super__Function_base._M_functor._8_8_ = 0;
  cbs.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  cbs.default_handler._M_invoker = (_Invoker_type)0x0;
  input_db_path._M_dataplus._M_p = (pointer)&input_db_path.field_2;
  input_db_path._M_string_length = 0;
  output_db_path._M_dataplus._M_p = (pointer)&output_db_path.field_2;
  output_db_path._M_string_length = 0;
  input_db_path.field_2._M_local_buf[0] = '\0';
  whitelist._M_dataplus._M_p = (pointer)&whitelist.field_2;
  whitelist._M_string_length = 0;
  blacklist._M_dataplus._M_p = (pointer)&blacklist.field_2;
  blacklist._M_string_length = 0;
  output_db_path.field_2._M_local_buf[0] = '\0';
  whitelist.field_2._M_local_buf[0] = '\0';
  blacklist.field_2._M_local_buf[0] = '\0';
  timestamp._M_dataplus._M_p = (pointer)&timestamp.field_2;
  timestamp._M_string_length = 0;
  timestamp.field_2._M_local_buf[0] = '\0';
  timestamp_seconds = 0;
  application_hash = 0;
  should_filter_application_hash = false;
  skip_application_info_links = false;
  invert_module_pruning = false;
  filter_graphics._M_h._M_buckets = &filter_graphics._M_h._M_single_bucket;
  filter_graphics._M_h._M_bucket_count = 1;
  filter_graphics._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  filter_graphics._M_h._M_element_count = 0;
  filter_graphics._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  filter_graphics._M_h._M_rehash_policy._M_next_resize = 0;
  filter_graphics._M_h._M_single_bucket = (__node_base_ptr)0x0;
  filter_compute._M_h._M_buckets = &filter_compute._M_h._M_single_bucket;
  filter_compute._M_h._M_bucket_count = 1;
  filter_compute._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  filter_compute._M_h._M_element_count = 0;
  filter_compute._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  filter_compute._M_h._M_rehash_policy._M_next_resize = 0;
  filter_compute._M_h._M_single_bucket = (__node_base_ptr)0x0;
  filter_raytracing._M_h._M_buckets = &filter_raytracing._M_h._M_single_bucket;
  filter_raytracing._M_h._M_bucket_count = 1;
  filter_raytracing._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  filter_raytracing._M_h._M_element_count = 0;
  filter_raytracing._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  filter_raytracing._M_h._M_rehash_policy._M_next_resize = 0;
  filter_raytracing._M_h._M_single_bucket = (__node_base_ptr)0x0;
  filter_modules._M_h._M_buckets = &filter_modules._M_h._M_single_bucket;
  filter_modules._M_h._M_bucket_count = 1;
  filter_modules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  filter_modules._M_h._M_element_count = 0;
  filter_modules._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  filter_modules._M_h._M_rehash_policy._M_next_resize = 0;
  filter_modules._M_h._M_single_bucket = (__node_base_ptr)0x0;
  banned_graphics._M_h._M_buckets = &banned_graphics._M_h._M_single_bucket;
  banned_graphics._M_h._M_bucket_count = 1;
  banned_graphics._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  banned_graphics._M_h._M_element_count = 0;
  banned_graphics._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  banned_graphics._M_h._M_rehash_policy._M_next_resize = 0;
  banned_graphics._M_h._M_single_bucket = (__node_base_ptr)0x0;
  banned_compute._M_h._M_buckets = &banned_compute._M_h._M_single_bucket;
  banned_compute._M_h._M_bucket_count = 1;
  banned_compute._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  banned_compute._M_h._M_element_count = 0;
  banned_compute._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  banned_compute._M_h._M_rehash_policy._M_next_resize = 0;
  banned_compute._M_h._M_single_bucket = (__node_base_ptr)0x0;
  banned_raytracing._M_h._M_buckets = &banned_raytracing._M_h._M_single_bucket;
  banned_raytracing._M_h._M_bucket_count = 1;
  banned_raytracing._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  banned_raytracing._M_h._M_element_count = 0;
  banned_raytracing._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  banned_raytracing._M_h._M_rehash_policy._M_next_resize = 0;
  banned_raytracing._M_h._M_single_bucket = (__node_base_ptr)0x0;
  banned_modules._M_h._M_buckets = &banned_modules._M_h._M_single_bucket;
  banned_modules._M_h._M_bucket_count = 1;
  banned_modules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  banned_modules._M_h._M_element_count = 0;
  banned_modules._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  banned_modules._M_h._M_rehash_policy._M_next_resize = 0;
  banned_modules._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_878._0_8_ = (void *)0x0;
  local_878._8_8_ = 0;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:578:20)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:578:20)>
              ::_M_manager;
  Fossilize::CLICallbacks::add(&cbs,"--help",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &input_db_path;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:579:24)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:579:24)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--input-db",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &output_db_path;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:580:25)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:580:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--output-db",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._0_8_ = &application_hash;
  local_878._8_8_ = &should_filter_application_hash;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:581:34)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:581:34)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--filter-application",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &filter_graphics;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:585:31)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:585:31)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--filter-graphics",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &filter_compute;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:588:30)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:588:30)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--filter-compute",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &filter_raytracing;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:591:33)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:591:33)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--filter-raytracing",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &filter_modules;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:594:29)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:594:29)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--filter-module",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._0_8_ = &timestamp;
  local_878._8_8_ = &timestamp_seconds;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:597:32)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:597:32)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--filter-timestamp",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &banned_graphics;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:601:29)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:601:29)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--skip-graphics",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &banned_compute;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:604:28)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:604:28)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--skip-compute",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &banned_raytracing;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:607:31)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:607:31)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--skip-raytracing",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &banned_modules;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:610:27)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:610:27)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--skip-module",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &skip_application_info_links;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:613:43)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:613:43)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--skip-application-info-links",
             (function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &invert_module_pruning;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:616:37)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:616:37)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--invert-module-pruning",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &whitelist;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:619:25)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:619:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--whitelist",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  local_878._8_8_ = 0;
  local_878._0_8_ = &blacklist;
  local_860._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:622:25)>
       ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:622:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--blacklist",(function<void_(Fossilize::CLIParser_&)> *)local_878);
  if (local_868 != (_Manager_type)0x0) {
    (*local_868)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  p_Var6 = cbs.error_handler.super__Function_base._M_manager;
  local_878._0_8_ = cbs.error_handler.super__Function_base._M_functor._M_unused._M_object;
  local_878._8_8_ = cbs.error_handler.super__Function_base._M_functor._8_8_;
  cbs.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  cbs.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_868 = cbs.error_handler.super__Function_base._M_manager;
  cbs.error_handler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:625:22)>
       ::_M_manager;
  local_860._M_nxt = (_Hash_node_base *)cbs.error_handler._M_invoker;
  cbs.error_handler._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:625:22)>
       ::_M_invoke;
  if (p_Var6 != (_Manager_type)0x0) {
    (*p_Var6)((_Any_data *)local_878,(_Any_data *)local_878,__destroy_functor);
  }
  Fossilize::CLICallbacks::CLICallbacks(&local_a8,&cbs);
  Fossilize::CLIParser::CLIParser(&parser,&local_a8,argc + -1,argv + 1);
  Fossilize::CLICallbacks::~CLICallbacks(&local_a8);
  bVar7 = Fossilize::CLIParser::parse(&parser);
  if (!bVar7) {
LAB_001056b3:
    iVar9 = 1;
    goto LAB_001056b6;
  }
  iVar9 = 0;
  if (parser.ended_state != false) goto LAB_001056b6;
  if ((input_db_path._M_string_length == 0) || (output_db_path._M_string_length == 0)) {
    print_help();
    goto LAB_001056b3;
  }
  iVar9 = 1;
  this = Fossilize::create_database(input_db_path._M_dataplus._M_p,ReadOnly);
  output_db = Fossilize::create_database(output_db_path._M_dataplus._M_p,OverWrite);
  if (this == (DatabaseInterface *)0x0) {
LAB_001057ee:
    pcVar15 = "Fossilize ERROR: Failed to load database: %s\n";
    _Var13._M_p = argv[1];
LAB_00105bb1:
    fprintf(_stderr,pcVar15,_Var13._M_p);
  }
  else {
    if ((whitelist._M_string_length != 0) &&
       (bVar7 = Fossilize::DatabaseInterface::load_whitelist_database
                          (this,whitelist._M_dataplus._M_p), !bVar7)) {
      pcVar15 = "Fossilize ERROR: Failed to install whitelist database %s.\n";
      _Var13 = whitelist._M_dataplus;
      goto LAB_00105bb1;
    }
    if ((blacklist._M_string_length != 0) &&
       (bVar7 = Fossilize::DatabaseInterface::load_blacklist_database
                          (this,blacklist._M_dataplus._M_p), !bVar7)) {
      pcVar15 = "Fossilize ERROR: Failed to install blacklist database %s.\n";
      _Var13 = blacklist._M_dataplus;
      goto LAB_00105bb1;
    }
    iVar8 = (*this->_vptr_DatabaseInterface[2])(this);
    if ((char)iVar8 == '\0') goto LAB_001057ee;
    if ((output_db == (DatabaseInterface *)0x0) ||
       (iVar8 = (*output_db->_vptr_DatabaseInterface[2])(output_db), (char)iVar8 == '\0')) {
      pcVar15 = "Fossilize ERROR: Failed to open database for writing: %s\n";
      _Var13._M_p = argv[2];
      goto LAB_00105bb1;
    }
    Fossilize::StateReplayer::StateReplayer(&replayer);
    PruneReplayer::PruneReplayer((PruneReplayer *)local_878);
    Fossilize::StateReplayer::set_resolve_shader_module_handles(&replayer,false);
    if (should_filter_application_hash == true) {
      local_158 = true;
      local_160 = application_hash;
    }
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&local_6b0,&filter_graphics);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&local_678,&filter_compute);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&local_640,&filter_raytracing);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&local_608,&filter_modules);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&local_5d0,&banned_graphics);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&local_598,&banned_compute);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&local_560,&banned_raytracing);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(local_528,&banned_modules);
    local_146 = skip_application_info_links;
    if (timestamp._M_string_length == 0) {
LAB_0010530d:
      per_tag_read[4] = 0;
      per_tag_read[5] = 0;
      per_tag_read[6] = 0;
      per_tag_read[7] = 0;
      per_tag_read[8] = 0;
      per_tag_read[9] = 0;
      per_tag_read[0] = 0;
      per_tag_read[1] = 0;
      per_tag_read[2] = 0;
      per_tag_read[3] = 0;
      per_tag_written[8] = 0;
      per_tag_written[9] = 0;
      per_tag_written[4] = 0;
      per_tag_written[5] = 0;
      per_tag_written[6] = 0;
      per_tag_written[7] = 0;
      per_tag_written[0] = 0;
      per_tag_written[1] = 0;
      per_tag_written[2] = 0;
      per_tag_written[3] = 0;
      state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c68 = output_db;
      for (lVar16 = 0; output_db = local_c68, lVar16 != 0x24; lVar16 = lVar16 + 4) {
        hash_count = 0;
        uVar1 = *(uint *)((long)main::playback_order + lVar16);
        uVar11 = (ulong)uVar1;
        iVar9 = (*this->_vptr_DatabaseInterface[6])(this,uVar11,&hash_count);
        if ((char)iVar9 == '\0') {
          fwrite("Fossilize ERROR: Failed to get hashes.\n",0x27,1,_stderr);
          iVar9 = 1;
          output_db = local_c68;
          goto LAB_001057a3;
        }
        per_tag_read[uVar11] = (uint)hash_count;
        if (uVar11 != 4) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&hashes,hash_count,(allocator_type *)&accepted_hashes);
          iVar9 = (*this->_vptr_DatabaseInterface[6])(this,(ulong)uVar1,&hash_count);
          puVar5 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((char)iVar9 == '\0') {
            pcVar15 = "Fossilize ERROR: Failed to get shader module hashes.\n";
            sStack_c80 = 0x35;
LAB_001057df:
            fwrite(pcVar15,sStack_c80,1,_stderr);
LAB_00105791:
            iVar9 = 1;
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            output_db = local_c68;
            goto LAB_001057a3;
          }
          pHVar18 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pHVar3 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((uVar11 == 0) && (local_170._M_head_impl != (DatabaseInterface *)0x0)) {
            accepted_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            latest_hash = 0;
            accepted_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            accepted_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            uVar14 = 0;
            for (puVar17 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start; puVar17 != puVar5;
                puVar17 = puVar17 + 1) {
              hash = *puVar17;
              ts = 0;
              if ((hash == application_hash) ||
                 (bVar7 = PruneReplayer::filter_timestamp
                                    ((PruneReplayer *)local_878,RESOURCE_APPLICATION_INFO,hash,&ts),
                 bVar7)) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (&accepted_hashes,&hash);
              }
              if (uVar14 < ts) {
                latest_hash = hash;
                uVar14 = ts;
              }
            }
            if (accepted_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                accepted_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &accepted_hashes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                         &latest_hash);
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                      (&hashes,&accepted_hashes.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&accepted_hashes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            pHVar18 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pHVar3 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          for (; pHVar18 != pHVar3; pHVar18 = pHVar18 + 1) {
            HVar2 = *pHVar18;
            iVar9 = (*this->_vptr_DatabaseInterface[3])
                              (this,(ulong)uVar1,HVar2,&accepted_hashes,0,0);
            if ((char)iVar9 == '\0') {
LAB_001057cc:
              pcVar15 = "Fossilize ERROR: Failed to load blob from cache.\n";
              sStack_c80 = 0x31;
              goto LAB_001057df;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&state_json,
                       (size_type)
                       accepted_hashes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start);
            iVar9 = (*this->_vptr_DatabaseInterface[3])
                              (this,(ulong)uVar1,HVar2,&accepted_hashes,
                               state_json.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            if ((char)iVar9 == '\0') goto LAB_001057cc;
            local_148._0_1_ = false;
            local_148._1_1_ = false;
            bVar7 = Fossilize::StateReplayer::parse
                              (&replayer,(StateCreatorInterface *)local_878,this,
                               state_json.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)state_json.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)state_json.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            if (!bVar7) {
              fprintf(_stderr,"Fossilize ERROR: Failed to parse blob (tag: %d, hash: 0x%lx).\n",
                      (ulong)uVar1);
            }
            if ((uVar11 == 0) &&
               ((should_filter_application_hash != true || (HVar2 == application_hash)))) {
              latest_hash = 0;
              iVar9 = (*this->_vptr_DatabaseInterface[3])(this,0,HVar2,&latest_hash,0,1);
              if ((char)iVar9 == '\0') goto LAB_00105791;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&state_json,latest_hash);
              iVar9 = (*this->_vptr_DatabaseInterface[3])
                                (this,0,HVar2,&latest_hash,
                                 state_json.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,1);
              if (((char)iVar9 == '\0') ||
                 (iVar9 = (*local_c68->_vptr_DatabaseInterface[4])(local_c68,0,HVar2),
                 (char)iVar9 == '\0')) goto LAB_00105791;
              per_tag_written[0] = per_tag_written[0] + 1;
            }
          }
          if (uVar11 == 9) {
            PruneReplayer::access_raytracing_pipelines((PruneReplayer *)local_878);
          }
          else if (uVar1 == 6) {
            PruneReplayer::access_graphics_pipelines((PruneReplayer *)local_878);
          }
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        }
      }
      iVar9 = 0;
      if (invert_module_pruning == true) {
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear(local_1e0);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_878 + 8));
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear(&local_838);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear(&local_790);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear(&local_800);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear(&local_758);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear(&local_720);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear(&local_6e8);
        hash_count = 0;
        iVar9 = (*this->_vptr_DatabaseInterface[6])(this,4,&hash_count,0);
        if ((char)iVar9 == '\0') {
          pcVar15 = "Fossilize ERROR: Failed to get hashes.\n";
          sStack_c80 = 0x27;
          goto LAB_00105cf2;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&accepted_hashes,hash_count,(allocator_type *)&hashes);
        iVar8 = (*this->_vptr_DatabaseInterface[6])
                          (this,4,&hash_count,
                           accepted_hashes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start);
        puVar5 = accepted_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((char)iVar8 == '\0') {
          fwrite("Fossilize ERROR: Failed to get shader module hashes.\n",0x35,1,_stderr);
          iVar9 = 1;
        }
        else {
          hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&p_Stack_b88;
          hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x1;
          hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p_Stack_b88 = (__node_base_ptr)0x0;
          for (puVar17 = accepted_hashes.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar17 != puVar5; puVar17 = puVar17 + 1)
          {
            sVar12 = std::
                     _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&local_7c8,puVar17);
            if (sVar12 == 0) {
              std::__detail::
              _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&hashes,puVar17);
            }
          }
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_move_assign(&local_7c8,
                           (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)&hashes);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&hashes);
          iVar9 = 0;
          output_db = local_c68;
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&accepted_hashes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        if ((char)iVar8 != '\0') goto LAB_0010599a;
      }
      else {
LAB_0010599a:
        bVar7 = copy_accessed_types(this,output_db,&state_json,
                                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                     *)local_1e0,RESOURCE_APPLICATION_BLOB_LINK,per_tag_written);
        if (bVar7) {
          bVar7 = copy_accessed_types(this,output_db,&state_json,
                                      (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                       *)(local_878 + 8),RESOURCE_SAMPLER,per_tag_written);
          if (bVar7) {
            bVar7 = copy_accessed_types(this,output_db,&state_json,
                                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                         *)&local_838,RESOURCE_DESCRIPTOR_SET_LAYOUT,per_tag_written
                                       );
            if (bVar7) {
              bVar7 = copy_accessed_types(this,output_db,&state_json,
                                          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                           *)&local_7c8,RESOURCE_SHADER_MODULE,per_tag_written);
              if (bVar7) {
                bVar7 = copy_accessed_types(this,output_db,&state_json,
                                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                             *)&local_790,RESOURCE_RENDER_PASS,per_tag_written);
                if (bVar7) {
                  bVar7 = copy_accessed_types(this,output_db,&state_json,
                                              (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                               *)&local_800,RESOURCE_PIPELINE_LAYOUT,per_tag_written
                                             );
                  if (bVar7) {
                    bVar7 = copy_accessed_types(this,output_db,&state_json,
                                                (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                 *)&local_758,RESOURCE_GRAPHICS_PIPELINE,
                                                per_tag_written);
                    if (bVar7) {
                      bVar7 = copy_accessed_types(this,output_db,&state_json,
                                                  (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&local_720,RESOURCE_COMPUTE_PIPELINE,
                                                  per_tag_written);
                      if (!bVar7) {
                        pcVar15 = "Fossilize ERROR: Failed to copy COMPUTE_PIPELINEs.\n";
                        goto LAB_00105d15;
                      }
                      bVar7 = copy_accessed_types(this,output_db,&state_json,
                                                  (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&local_6e8,RESOURCE_RAYTRACING_PIPELINE,
                                                  per_tag_written);
                      if (bVar7) {
                        for (lVar16 = 0; output_db = local_c68, lVar16 != 0x24; lVar16 = lVar16 + 4)
                        {
                          uVar11 = (ulong)*(uint *)((long)main::playback_order + lVar16);
                          fprintf(_stderr,"Fossilize INFO: Pruned %s entries: %u -> %u entries\n",
                                  _ZZ4mainE9tag_names_rel +
                                  *(int *)(_ZZ4mainE9tag_names_rel + uVar11 * 4),
                                  (ulong)per_tag_read[uVar11],(ulong)per_tag_written[uVar11]);
                        }
                        goto LAB_001057a3;
                      }
                      pcVar15 = "Fossilize ERROR: Failed to copy RAYTRACING_PIPELINEs.\n";
                      sStack_c80 = 0x36;
                    }
                    else {
                      pcVar15 = "Fossilize ERROR: Failed to copy GRAPHICS_PIPELINEs.\n";
                      sStack_c80 = 0x34;
                    }
                  }
                  else {
                    pcVar15 = "Fossilize ERROR: Failed to copy PIPELINE_LAYOUTs.\n";
                    sStack_c80 = 0x32;
                  }
                }
                else {
                  pcVar15 = "Fossilize ERROR: Failed to copy RENDER_PASSes.\n";
                  sStack_c80 = 0x2f;
                }
              }
              else {
                pcVar15 = "Fossilize ERROR: Failed to copy SHADER_MODULEs.\n";
                sStack_c80 = 0x30;
              }
            }
            else {
              pcVar15 = "Fossilize ERROR: Failed to copy DESCRIPTOR_SET_LAYOUTs.\n";
              sStack_c80 = 0x38;
            }
          }
          else {
            pcVar15 = "Fossilize ERROR: Failed to copy RESOURCE_SAMPLERs.\n";
LAB_00105d15:
            sStack_c80 = 0x33;
          }
          fwrite(pcVar15,sStack_c80,1,_stderr);
          iVar9 = 1;
        }
        else {
          pcVar15 = "Fossilize ERROR: Failed to copy APPLICATION_BLOCK_LINK.\n";
          sStack_c80 = 0x38;
LAB_00105cf2:
          fwrite(pcVar15,sStack_c80,1,_stderr);
          iVar9 = 1;
        }
      }
LAB_001057a3:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    else {
      iVar9 = 1;
      _Var10._M_head_impl =
           Fossilize::create_stream_archive_database(timestamp._M_dataplus._M_p,ReadOnly);
      if (local_170._M_head_impl != (DatabaseInterface *)0x0) {
        ppp_Var4 = &(local_170._M_head_impl)->_vptr_DatabaseInterface;
        local_170._M_head_impl = _Var10._M_head_impl;
        (*(*ppp_Var4)[1])();
        _Var10._M_head_impl = local_170._M_head_impl;
      }
      local_170._M_head_impl = _Var10._M_head_impl;
      iVar8 = (*(local_170._M_head_impl)->_vptr_DatabaseInterface[2])();
      if ((char)iVar8 != '\0') {
        uVar11 = time((time_t *)0x0);
        local_168 = uVar11 - timestamp_seconds;
        if (uVar11 < timestamp_seconds) {
          local_168 = 0;
        }
        goto LAB_0010530d;
      }
      fwrite("Fossilize ERROR: Failed to open timestamp DB.\n",0x2e,1,_stderr);
    }
    PruneReplayer::~PruneReplayer((PruneReplayer *)local_878);
    Fossilize::StateReplayer::~StateReplayer(&replayer);
  }
  if (output_db != (DatabaseInterface *)0x0) {
    (*output_db->_vptr_DatabaseInterface[1])(output_db);
  }
  if (this != (DatabaseInterface *)0x0) {
    (*this->_vptr_DatabaseInterface[1])(this);
  }
LAB_001056b6:
  Fossilize::CLICallbacks::~CLICallbacks(&parser.cbs);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&banned_modules._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&banned_raytracing._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&banned_compute._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&banned_graphics._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&filter_modules._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&filter_raytracing._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&filter_compute._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&filter_graphics._M_h);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  Fossilize::CLICallbacks::~CLICallbacks(&cbs);
  return iVar9;
}

Assistant:

int main(int argc, char *argv[])
{
	CLICallbacks cbs;
	string input_db_path;
	string output_db_path;
	string whitelist, blacklist, timestamp;
	unsigned timestamp_seconds = 0;
	Hash application_hash = 0;
	bool should_filter_application_hash = false;
	bool skip_application_info_links = false;
	bool invert_module_pruning = false;

	unordered_set<Hash> filter_graphics;
	unordered_set<Hash> filter_compute;
	unordered_set<Hash> filter_raytracing;
	unordered_set<Hash> filter_modules;

	unordered_set<Hash> banned_graphics;
	unordered_set<Hash> banned_compute;
	unordered_set<Hash> banned_raytracing;
	unordered_set<Hash> banned_modules;

	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--input-db", [&](CLIParser &parser) { input_db_path = parser.next_string(); });
	cbs.add("--output-db", [&](CLIParser &parser) { output_db_path = parser.next_string(); });
	cbs.add("--filter-application", [&](CLIParser &parser) {
		application_hash = strtoull(parser.next_string(), nullptr, 16);
		should_filter_application_hash = true;
	});
	cbs.add("--filter-graphics", [&](CLIParser &parser) {
		filter_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-compute", [&](CLIParser &parser) {
		filter_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-raytracing", [&](CLIParser &parser) {
		filter_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-module", [&](CLIParser &parser) {
		filter_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-timestamp", [&](CLIParser &parser) {
		timestamp = parser.next_string();
		timestamp_seconds = parser.next_uint();
	});
	cbs.add("--skip-graphics", [&](CLIParser &parser) {
		banned_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-compute", [&](CLIParser &parser) {
		banned_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-raytracing", [&](CLIParser &parser) {
		banned_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-module", [&](CLIParser &parser) {
		banned_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-application-info-links", [&](CLIParser &) {
		skip_application_info_links = true;
	});
	cbs.add("--invert-module-pruning", [&](CLIParser &) {
		invert_module_pruning = true;
	});
	cbs.add("--whitelist", [&](CLIParser &parser) {
		whitelist = parser.next_string();
	});
	cbs.add("--blacklist", [&](CLIParser &parser) {
		blacklist = parser.next_string();
	});
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(std::move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (input_db_path.empty() || output_db_path.empty())
	{
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(input_db_path.c_str(), DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(output_db_path.c_str(), DatabaseMode::OverWrite));

	if (input_db && !whitelist.empty())
	{
		if (!input_db->load_whitelist_database(whitelist.c_str()))
		{
			LOGE("Failed to install whitelist database %s.\n", whitelist.c_str());
			return EXIT_FAILURE;
		}
	}

	if (input_db && !blacklist.empty())
	{
		if (!input_db->load_blacklist_database(blacklist.c_str()))
		{
			LOGE("Failed to install blacklist database %s.\n", blacklist.c_str());
			return EXIT_FAILURE;
		}
	}

	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db || !output_db->prepare())
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	StateReplayer replayer;
	PruneReplayer prune_replayer;

	replayer.set_resolve_shader_module_handles(false);

	if (should_filter_application_hash)
	{
		prune_replayer.should_filter_application_hash = true;
		prune_replayer.filter_application_hash = application_hash;
	}

	prune_replayer.filter_graphics = std::move(filter_graphics);
	prune_replayer.filter_compute = std::move(filter_compute);
	prune_replayer.filter_raytracing = std::move(filter_raytracing);
	prune_replayer.filter_modules = std::move(filter_modules);
	prune_replayer.banned_graphics = std::move(banned_graphics);
	prune_replayer.banned_compute = std::move(banned_compute);
	prune_replayer.banned_raytracing = std::move(banned_raytracing);
	prune_replayer.banned_modules = std::move(banned_modules);
	prune_replayer.skip_application_info_links = skip_application_info_links;

	if (!timestamp.empty())
	{
		prune_replayer.timestamp_db.reset(create_stream_archive_database(timestamp.c_str(), DatabaseMode::ReadOnly));
		if (!prune_replayer.timestamp_db->prepare())
		{
			LOGE("Failed to open timestamp DB.\n");
			return EXIT_FAILURE;
		}
		prune_replayer.timestamp_minimum_accept = time(nullptr);
		prune_replayer.timestamp_minimum_accept -=
				std::min<uint64_t>(prune_replayer.timestamp_minimum_accept, timestamp_seconds);
	}

	static const ResourceTag playback_order[] = {
		RESOURCE_APPLICATION_INFO,
		RESOURCE_APPLICATION_BLOB_LINK,
		RESOURCE_SHADER_MODULE,
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Implicitly pulls in dependent samplers.
		RESOURCE_PIPELINE_LAYOUT,
		RESOURCE_RENDER_PASS,
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	unsigned per_tag_read[RESOURCE_COUNT] = {};
	unsigned per_tag_written[RESOURCE_COUNT] = {};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Application Blob Link",
		"Raytracing Pipeline",
	};

	vector<uint8_t> state_json;

	for (auto &tag : playback_order)
	{
		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		per_tag_read[tag] = hash_count;

		// No need to resolve this type.
		if (tag == RESOURCE_SHADER_MODULE)
			continue;

		vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		// Filter application infos as well,
		// but avoid a situation where we omit all application infos since these are very important in replay.
		if (tag == RESOURCE_APPLICATION_INFO && prune_replayer.timestamp_db)
		{
			vector<Hash> accepted_hashes;
			uint64_t latest_ts = 0;
			Hash latest_hash = 0;

			for (auto hash : hashes)
			{
				uint64_t ts = 0;
				if (hash == application_hash || prune_replayer.filter_timestamp(RESOURCE_APPLICATION_INFO, hash, &ts))
					accepted_hashes.push_back(hash);

				if (ts > latest_ts)
				{
					latest_hash = hash;
					latest_ts = ts;
				}
			}

			if (accepted_hashes.empty())
				accepted_hashes.push_back(latest_hash);

			hashes = std::move(accepted_hashes);
		}

		for (auto hash : hashes)
		{
			size_t state_json_size;
			if (!input_db->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);

			if (!input_db->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			prune_replayer.has_application_info_for_blob = false;
			prune_replayer.blob_belongs_to_application_info = false;
			if (!replayer.parse(prune_replayer, input_db.get(), state_json.data(), state_json.size()))
				LOGE("Failed to parse blob (tag: %d, hash: 0x%" PRIx64 ").\n", tag, hash);

			if (tag == RESOURCE_APPLICATION_INFO)
			{
				if (!should_filter_application_hash || hash == application_hash)
				{
					size_t compressed_size = 0;
					if (!input_db->read_entry(tag, hash, &compressed_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					state_json.resize(compressed_size);
					if (!input_db->read_entry(tag, hash, &compressed_size, state_json.data(),
					                          PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					if (!output_db->write_entry(tag, hash, state_json.data(), state_json.size(),
					                            PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					per_tag_written[tag]++;
				}
			}
		}

		if (tag == RESOURCE_GRAPHICS_PIPELINE)
			prune_replayer.access_graphics_pipelines();
		else if (tag == RESOURCE_RAYTRACING_PIPELINE)
			prune_replayer.access_raytracing_pipelines();
	}

	if (invert_module_pruning)
	{
		// In this mode we're only interesting in emitting the shader modules we did not emit for whatever reason.
		// A handy debug option in some scenarios.
		prune_replayer.filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK].clear();
		prune_replayer.accessed_samplers.clear();
		prune_replayer.accessed_descriptor_sets.clear();
		prune_replayer.accessed_render_passes.clear();
		prune_replayer.accessed_pipeline_layouts.clear();
		prune_replayer.accessed_graphics_pipelines.clear();
		prune_replayer.accessed_compute_pipelines.clear();
		prune_replayer.accessed_raytracing_pipelines.clear();

		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(RESOURCE_SHADER_MODULE, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(RESOURCE_SHADER_MODULE, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		unordered_set<Hash> unreferenced_modules;
		for (auto &h : hashes)
			if (prune_replayer.accessed_shader_modules.count(h) == 0)
				unreferenced_modules.insert(h);
		prune_replayer.accessed_shader_modules = std::move(unreferenced_modules);
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK],
	                         RESOURCE_APPLICATION_BLOB_LINK,
	                         per_tag_written))
	{
		LOGE("Failed to copy APPLICATION_BLOCK_LINK.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_samplers, RESOURCE_SAMPLER,
	                         per_tag_written))
	{
		LOGE("Failed to copy RESOURCE_SAMPLERs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_descriptor_sets, RESOURCE_DESCRIPTOR_SET_LAYOUT,
	                         per_tag_written))
	{
		LOGE("Failed to copy DESCRIPTOR_SET_LAYOUTs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_shader_modules, RESOURCE_SHADER_MODULE,
	                         per_tag_written))
	{
		LOGE("Failed to copy SHADER_MODULEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_render_passes, RESOURCE_RENDER_PASS,
	                         per_tag_written))
	{
		LOGE("Failed to copy RENDER_PASSes.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_pipeline_layouts, RESOURCE_PIPELINE_LAYOUT,
	                         per_tag_written))
	{
		LOGE("Failed to copy PIPELINE_LAYOUTs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_graphics_pipelines, RESOURCE_GRAPHICS_PIPELINE,
	                         per_tag_written))
	{
		LOGE("Failed to copy GRAPHICS_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_compute_pipelines, RESOURCE_COMPUTE_PIPELINE,
	                         per_tag_written))
	{
		LOGE("Failed to copy COMPUTE_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
							 prune_replayer.accessed_raytracing_pipelines, RESOURCE_RAYTRACING_PIPELINE,
							 per_tag_written))
	{
		LOGE("Failed to copy RAYTRACING_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	for (auto tag : playback_order)
		LOGI("Pruned %s entries: %u -> %u entries\n", tag_names[tag], per_tag_read[tag], per_tag_written[tag]);
}